

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniquePtrVector.h
# Opt level: O0

void __thiscall
dg::vr::UniquePtrVector<dg::vr::VRLocation>::emplace_back<unsigned_long>
          (UniquePtrVector<dg::vr::VRLocation> *this,unsigned_long *args)

{
  VRLocation **__args;
  vector<std::unique_ptr<dg::vr::VRLocation,_std::default_delete<dg::vr::VRLocation>_>,_std::allocator<std::unique_ptr<dg::vr::VRLocation,_std::default_delete<dg::vr::VRLocation>_>_>_>
  *in_RSI;
  VRLocation *in_RDI;
  
  __args = (VRLocation **)operator_new(0x140);
  VRLocation::VRLocation(in_RDI,(uint)((ulong)__args >> 0x20));
  std::
  vector<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>,std::allocator<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>>>
  ::emplace_back<dg::vr::VRLocation*>(in_RSI,__args);
  return;
}

Assistant:

void emplace_back(Args &&...args) {
        _v.emplace_back(new T(std::forward<Args>(args)...));
    }